

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O2

string * markdown::token::RawText::_processLinksImagesAndTags
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements,
                   LinkIds *idTable)

{
  undefined **ppuVar1;
  char *pcVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t x;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  const_reference pvVar9;
  RawText *pRVar10;
  long lVar11;
  Container *pCVar12;
  Image *this;
  HtmlAnchorTag *pHVar13;
  HtmlTag *pHVar14;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var15;
  size_t sVar16;
  unsigned_long *arg;
  long lVar17;
  unsigned_long *arg_00;
  string *this_00;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pmVar18;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  size_type sVar19;
  string contentsOrAlttext;
  string url;
  string linkId;
  string title;
  optional<markdown::LinkIds::Target> target;
  long local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  smatch m;
  
  if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
       ::cExpression == '\0') &&
     (iVar8 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                   ::cExpression), iVar8 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&_processLinksImagesAndTags::cExpression,
                "(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)|(?:<(/?([a-zA-Z0-9]+).*?)>)"
                ,0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&_processLinksImagesAndTags::cExpression,&__dso_handle);
    __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                         ::cExpression);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  first._M_current = (src->_M_dataplus)._M_p;
  last._M_current = first._M_current + src->_M_string_length;
  do {
    m.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    m.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    m.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m.m_base._M_current = (char *)0x0;
    m.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    m.m_null.matched = false;
    m.m_named_subs.px = (element_type *)0x0;
    m.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    m.m_last_closed_paren = 0;
    m.m_is_singular = true;
    bVar6 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      (first,last,&m,&_processLinksImagesAndTags::cExpression,format_default);
    pmVar18 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&target;
    if (bVar6) {
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&m,0);
      if (pvVar9->matched == false) {
        __assert_fail("m[0].matched",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17d,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&m,0);
      if ((pvVar9->matched != true) ||
         ((pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).second._M_current ==
          (pvVar9->
          super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).first._M_current)) {
        __assert_fail("m[0].length()!=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x17e,
                      "static std::string markdown::token::RawText::_processLinksImagesAndTags(const std::string &, ReplacementTable &, const LinkIds &)"
                     );
      }
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&m,0);
      target.super_type._0_8_ = (long)&target.super_type.m_storage.dummy_ + 8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&target,first._M_current,
                 (pvVar9->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&target);
      title._M_dataplus._M_p =
           (pointer)((long)(replacements->
                           super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(replacements->
                           super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4);
      boost::lexical_cast<std::__cxx11::string,unsigned_long>(&url,(boost *)&title,arg);
      std::operator+(&contentsOrAlttext,"\x01@",&url);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target,
                     &contentsOrAlttext,"@links&Images1\x01");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&target);
      std::__cxx11::string::~string((string *)&contentsOrAlttext);
      std::__cxx11::string::~string((string *)&url);
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&m,0);
      first._M_current =
           (pvVar9->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
      pvVar9 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&m,4);
      if ((pvVar9->matched == true) &&
         (pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&m,4), pvVar9->matched == true)) {
        bVar3 = true;
        bVar7 = true;
        if ((pvVar9->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).second._M_current ==
            (pvVar9->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).first._M_current) goto LAB_00151aa8;
      }
      else {
LAB_00151aa8:
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,1);
        if (((pvVar9->matched == true) &&
            (pvVar9 = boost::
                      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&m,1), pvVar9->matched == true)) &&
           ((pvVar9->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).second._M_current !=
            (pvVar9->
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).first._M_current)) {
          bVar3 = true;
        }
        else {
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&m,5);
          if (pvVar9->matched != false) {
            bVar7 = true;
            bVar3 = false;
            goto LAB_00151b41;
          }
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&m,2);
          if (pvVar9->matched != true) {
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&m,7);
            boost::sub_match::operator_cast_to_string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target,
                       (sub_match *)pvVar9);
            lVar11 = 0;
            do {
              if (lVar11 == 7) {
                _Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                                   (target.super_type._0_8_,
                                    (long)target.super_type.m_storage.dummy_.aligner_ +
                                    target.super_type._0_8_,anon_unknown_0::notValidNameCharacter);
                if (((_Var15._M_current !=
                      (char *)((long)target.super_type.m_storage.dummy_.aligner_ +
                              target.super_type._0_8_)) &&
                    (_Var15._M_current != (char *)target.super_type._0_8_)) &&
                   (*_Var15._M_current == '@')) {
                  _Var15 = std::
                           __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<bool(*)(char)>>
                                     (_Var15._M_current + 1,
                                      (char *)((long)target.super_type.m_storage.dummy_.aligner_ +
                                              target.super_type._0_8_),
                                      anon_unknown_0::notValidSiteCharacter);
                  if (_Var15._M_current ==
                      (char *)((long)target.super_type.m_storage.dummy_.aligner_ +
                              target.super_type._0_8_)) {
                    title._M_dataplus._M_p = (pointer)target.super_type._0_8_;
                    url._M_dataplus._M_p =
                         (char *)((long)target.super_type.m_storage.dummy_.aligner_ +
                                 target.super_type._0_8_);
                    std::
                    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,bool(*)(char)>
                              ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&contentsOrAlttext,
                               (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&url,(_func_bool_char *)&title);
                    if (((contentsOrAlttext._M_dataplus._M_p != (pointer)target.super_type._0_8_) &&
                        (contentsOrAlttext._M_dataplus._M_p[-1] == '.')) &&
                       (0xfffffffffffffffc <
                        ((target.super_type._0_8_ +
                         (long)target.super_type.m_storage.dummy_.aligner_) -
                        (long)contentsOrAlttext._M_dataplus._M_p) - 5U)) {
                      linkId._M_dataplus._M_p = (pointer)&linkId;
                      linkId.field_2._M_allocated_capacity = 0;
                      linkId._M_string_length = (size_type)linkId._M_dataplus._M_p;
                      pHVar13 = (HtmlAnchorTag *)operator_new(0x30);
                      std::operator+(&url,"mailto:",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&target);
                      anon_unknown_0::emailEncode(&contentsOrAlttext,&url);
                      title._M_dataplus._M_p = (pointer)&title.field_2;
                      title._M_string_length = 0;
                      title.field_2._M_local_buf[0] = '\0';
                      HtmlAnchorTag::HtmlAnchorTag(pHVar13,&contentsOrAlttext,&title);
                      boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                                ((shared_ptr<markdown::Token> *)&local_a8,pHVar13);
                      std::__cxx11::
                      list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                                   *)&linkId,(value_type *)&local_a8);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&local_a8._M_string_length);
                      std::__cxx11::string::~string((string *)&title);
                      std::__cxx11::string::~string((string *)&contentsOrAlttext);
                      std::__cxx11::string::~string((string *)&url);
                      pRVar10 = (RawText *)operator_new(0x30);
                      anon_unknown_0::emailEncode(&contentsOrAlttext,(string *)&target);
                      RawText(pRVar10,&contentsOrAlttext,false);
                      boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                                ((shared_ptr<markdown::Token> *)&url,pRVar10);
                      std::__cxx11::
                      list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                                   *)&linkId,(value_type *)&url);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&url._M_string_length);
                      std::__cxx11::string::~string((string *)&contentsOrAlttext);
                      pHVar14 = (HtmlTag *)operator_new(0x30);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&contentsOrAlttext,"/a",(allocator<char> *)&title);
                      HtmlTag::HtmlTag(pHVar14,&contentsOrAlttext);
                      boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                                ((shared_ptr<markdown::Token> *)&url,pHVar14);
                      std::__cxx11::
                      list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                      ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                                   *)&linkId,(value_type *)&url);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&url._M_string_length);
                      std::__cxx11::string::~string((string *)&contentsOrAlttext);
                      pCVar12 = (Container *)operator_new(0x28);
                      Container::Container(pCVar12,(TokenGroup *)&linkId);
                      boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                                ((shared_ptr<markdown::Token> *)&contentsOrAlttext,pCVar12);
                      std::
                      vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      ::emplace_back<boost::shared_ptr<markdown::Token>>
                                ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                                  *)replacements,(shared_ptr<markdown::Token> *)&contentsOrAlttext);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&contentsOrAlttext._M_string_length);
                      this_00 = &linkId;
                      goto LAB_00152069;
                    }
                  }
                }
                pvVar9 = boost::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[](&m,8);
                boost::sub_match::operator_cast_to_string(&contentsOrAlttext,(sub_match *)pvVar9);
                sVar16 = isValidTag(&contentsOrAlttext,false);
                std::__cxx11::string::~string((string *)&contentsOrAlttext);
                if (sVar16 == 0) {
                  pRVar10 = (RawText *)operator_new(0x30);
                  pvVar9 = boost::
                           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator[](&m,0);
                  boost::sub_match::operator_cast_to_string(&contentsOrAlttext,(sub_match *)pvVar9);
                  RawText(pRVar10,&contentsOrAlttext,true);
                  boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                            ((shared_ptr<markdown::Token> *)&url,pRVar10);
                  std::
                  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                  ::emplace_back<boost::shared_ptr<markdown::Token>>
                            ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                              *)replacements,(shared_ptr<markdown::Token> *)&url);
                }
                else {
                  pHVar14 = (HtmlTag *)operator_new(0x30);
                  _restoreProcessedItems(&contentsOrAlttext,(string *)&target,replacements);
                  HtmlTag::HtmlTag(pHVar14,&contentsOrAlttext);
                  boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                            ((shared_ptr<markdown::Token> *)&url,pHVar14);
                  std::
                  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                  ::emplace_back<boost::shared_ptr<markdown::Token>>
                            ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                              *)replacements,(shared_ptr<markdown::Token> *)&url);
                }
                boost::detail::shared_count::~shared_count((shared_count *)&url._M_string_length);
                std::__cxx11::string::~string((string *)&contentsOrAlttext);
                goto LAB_00152259;
              }
              ppuVar1 = &PTR_anon_var_dwarf_997e7_001718e0 + lVar11;
              lVar17 = 0;
              while( true ) {
                if ((*(char *)(target.super_type._0_8_ + lVar17) == '\0') ||
                   (*(char *)(target.super_type._0_8_ + lVar17) != (*ppuVar1)[lVar17])) break;
                lVar17 = lVar17 + 1;
              }
              lVar11 = lVar11 + 1;
            } while ((*ppuVar1)[lVar17] != '\0');
            url._M_dataplus._M_p = (pointer)&url;
            url.field_2._M_allocated_capacity = 0;
            url._M_string_length = (size_type)url._M_dataplus._M_p;
            pHVar13 = (HtmlAnchorTag *)operator_new(0x30);
            contentsOrAlttext._M_dataplus._M_p = (pointer)&contentsOrAlttext.field_2;
            contentsOrAlttext._M_string_length = 0;
            contentsOrAlttext.field_2._M_local_buf[0] = '\0';
            HtmlAnchorTag::HtmlAnchorTag(pHVar13,(string *)&target,&contentsOrAlttext);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                      ((shared_ptr<markdown::Token> *)&title,pHVar13);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)&url,(value_type *)&title);
            boost::detail::shared_count::~shared_count((shared_count *)&title._M_string_length);
            std::__cxx11::string::~string((string *)&contentsOrAlttext);
            pRVar10 = (RawText *)operator_new(0x30);
            RawText(pRVar10,(string *)&target,false);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                      ((shared_ptr<markdown::Token> *)&contentsOrAlttext,pRVar10);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)&url,(value_type *)&contentsOrAlttext);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&contentsOrAlttext._M_string_length);
            pHVar14 = (HtmlTag *)operator_new(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&contentsOrAlttext,"/a",(allocator<char> *)&linkId);
            HtmlTag::HtmlTag(pHVar14,&contentsOrAlttext);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                      ((shared_ptr<markdown::Token> *)&title,pHVar14);
            std::__cxx11::
            list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                         *)&url,(value_type *)&title);
            boost::detail::shared_count::~shared_count((shared_count *)&title._M_string_length);
            std::__cxx11::string::~string((string *)&contentsOrAlttext);
            pCVar12 = (Container *)operator_new(0x28);
            Container::Container(pCVar12,(TokenGroup *)&url);
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
                      ((shared_ptr<markdown::Token> *)&contentsOrAlttext,pCVar12);
            std::
            vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
            ::emplace_back<boost::shared_ptr<markdown::Token>>
                      ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                        *)replacements,(shared_ptr<markdown::Token> *)&contentsOrAlttext);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&contentsOrAlttext._M_string_length);
            this_00 = &url;
LAB_00152069:
            std::__cxx11::
            _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
            ::_M_clear((_List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                        *)this_00);
            goto LAB_00152259;
          }
          bVar3 = false;
        }
        bVar7 = false;
      }
LAB_00151b41:
      contentsOrAlttext._M_dataplus._M_p = (pointer)&contentsOrAlttext.field_2;
      contentsOrAlttext._M_string_length = 0;
      url._M_dataplus._M_p = (pointer)&url.field_2;
      url._M_string_length = 0;
      title._M_dataplus._M_p = (pointer)&title.field_2;
      title._M_string_length = 0;
      contentsOrAlttext.field_2._M_local_buf[0] = '\0';
      url.field_2._M_allocated_capacity = url.field_2._M_allocated_capacity & 0xffffffffffffff00;
      title.field_2._M_local_buf[0] = '\0';
      if (bVar7) {
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,5);
        boost::sub_match::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target,
                   (sub_match *)pvVar9);
        std::__cxx11::string::operator=((string *)&contentsOrAlttext,(string *)&target);
        std::__cxx11::string::~string((string *)&target);
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,6);
        if (pvVar9->matched == true) {
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&m,6);
          boost::sub_match::operator_cast_to_string(&linkId,(sub_match *)pvVar9);
          if (linkId._M_string_length == 0) goto LAB_00151d20;
        }
        else {
          linkId._M_dataplus._M_p = (pointer)&linkId.field_2;
          linkId._M_string_length = 0;
          linkId.field_2._M_allocated_capacity =
               linkId.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00151d20:
          sVar5 = contentsOrAlttext._M_string_length;
          _Var4._M_p = contentsOrAlttext._M_dataplus._M_p;
          target.super_type._0_8_ = (long)&target.super_type.m_storage.dummy_ + 8;
          target.super_type.m_storage.dummy_.aligner_ = (type)0x0;
          target.super_type.m_storage.dummy_._8_8_ =
               target.super_type.m_storage.dummy_._8_8_ & 0xffffffffffffff00;
          for (sVar19 = 0; sVar5 != sVar19; sVar19 = sVar19 + 1) {
            if (((_Var4._M_p[sVar19] != ' ') ||
                (target.super_type.m_storage.dummy_.aligner_ == (type)0x0)) ||
               (*(char *)(target.super_type._0_8_ + -1 +
                         (long)target.super_type.m_storage.dummy_.aligner_) != ' ')) {
              std::__cxx11::string::push_back
                        ((char)(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&target);
            }
          }
          std::__cxx11::string::operator=((string *)&linkId,(string *)&target);
          std::__cxx11::string::~string((string *)&target);
        }
        LinkIds::find(&target,idTable,&linkId);
        if (target.super_type.m_initialized != true) {
          boost::optional_detail::optional_base<markdown::LinkIds::Target>::~optional_base
                    ((optional_base<markdown::LinkIds::Target> *)&target);
          goto LAB_00151e23;
        }
        boost::optional<markdown::LinkIds::Target>::operator->(&target);
        std::__cxx11::string::_M_assign((string *)&url);
        boost::optional<markdown::LinkIds::Target>::operator->(&target);
        std::__cxx11::string::_M_assign((string *)&title);
        boost::optional_detail::optional_base<markdown::LinkIds::Target>::~optional_base
                  ((optional_base<markdown::LinkIds::Target> *)&target);
LAB_001520bf:
        std::__cxx11::string::~string((string *)&linkId);
        if (!bVar3) {
          pHVar13 = (HtmlAnchorTag *)operator_new(0x30);
          HtmlAnchorTag::HtmlAnchorTag(pHVar13,&url,&title);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlAnchorTag>
                    ((shared_ptr<markdown::Token> *)&target,pHVar13);
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      *)replacements,(shared_ptr<markdown::Token> *)&target);
          boost::detail::shared_count::~shared_count((shared_count *)&target.super_type.m_storage);
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          local_b0 = (long)(replacements->
                           super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(replacements->
                           super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4;
          boost::lexical_cast<std::__cxx11::string,unsigned_long>
                    (&local_a8,(boost *)&local_b0,arg_00);
          std::operator+(&linkId,"\x01@",&local_a8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &target,&linkId,"@links&Images2\x01");
          std::__cxx11::string::append((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&target);
          std::__cxx11::string::~string((string *)&linkId);
          std::__cxx11::string::~string((string *)&local_a8);
          pHVar14 = (HtmlTag *)operator_new(0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&target,"/a",(allocator<char> *)&local_a8);
          HtmlTag::HtmlTag(pHVar14,(string *)&target);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::HtmlTag>
                    ((shared_ptr<markdown::Token> *)&linkId,pHVar14);
          std::
          vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
          ::emplace_back<boost::shared_ptr<markdown::Token>>
                    ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                      *)replacements,(shared_ptr<markdown::Token> *)&linkId);
          goto LAB_0015222e;
        }
        this = (Image *)operator_new(0x68);
        Image::Image(this,&contentsOrAlttext,&url,&title);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Image>
                  ((shared_ptr<markdown::Token> *)&target,this);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,(shared_ptr<markdown::Token> *)&target);
        boost::detail::shared_count::~shared_count((shared_count *)&target.super_type.m_storage);
      }
      else {
        if ((_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
             ::cReference == '\0') &&
           (iVar8 = __cxa_guard_acquire(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                                         ::cReference), iVar8 != 0)) {
          boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
          basic_regex(&_processLinksImagesAndTags::cReference,
                      "^<?([^ >]*)>?(?: *(?:(\'|\")(.*)\\2)|(?:\\((.*)\\)))? *$",0);
          __cxa_atexit(boost::
                       basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                       ::~basic_regex,&_processLinksImagesAndTags::cReference,&__dso_handle);
          __cxa_guard_release(&_processLinksImagesAndTags(std::__cxx11::string_const&,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&,markdown::LinkIds_const&)
                               ::cReference);
        }
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,2);
        boost::sub_match::operator_cast_to_string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target,
                   (sub_match *)pvVar9);
        std::__cxx11::string::operator=((string *)&contentsOrAlttext,(string *)&target);
        std::__cxx11::string::~string((string *)&target);
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,3);
        boost::sub_match::operator_cast_to_string(&linkId,(sub_match *)pvVar9);
        target.super_type.m_storage.dummy_._24_8_ = 0;
        target.super_type.m_storage.dummy_._32_8_ = 0;
        target.super_type.m_storage.dummy_._8_8_ = 0;
        target.super_type.m_storage.dummy_._16_8_ = 0;
        target.super_type.m_initialized = false;
        target.super_type._1_7_ = 0;
        target.super_type.m_storage.dummy_.aligner_ = (type)0x0;
        target.super_type.m_storage.dummy_.data[0x28] = '\0';
        target.super_type.m_storage.dummy_._48_8_ = 0;
        target.super_type.m_storage.dummy_._56_8_ = 0;
        bVar7 = boost::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                          (&linkId,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&target,&_processLinksImagesAndTags::cReference,format_default
                          );
        if (bVar7) {
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&target,1);
          boost::sub_match::operator_cast_to_string(&local_a8,(sub_match *)pvVar9);
          std::__cxx11::string::operator=((string *)&url,(string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          pvVar9 = boost::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&target,3);
          if (pvVar9->matched == true) {
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&target,3);
            boost::sub_match::operator_cast_to_string(&local_a8,(sub_match *)pvVar9);
LAB_001520a2:
            std::__cxx11::string::operator=((string *)&title,(string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
          }
          else {
            pvVar9 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&target,4);
            if (pvVar9->matched == true) {
              pvVar9 = boost::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&target,4);
              boost::sub_match::operator_cast_to_string(&local_a8,(sub_match *)pvVar9);
              goto LAB_001520a2;
            }
          }
          boost::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&target);
          goto LAB_001520bf;
        }
        boost::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&target);
LAB_00151e23:
        std::__cxx11::string::~string((string *)&linkId);
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,0);
        pcVar2 = (pvVar9->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pRVar10 = (RawText *)operator_new(0x30);
        pvVar9 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&m,0);
        first._M_current = pcVar2 + 1;
        target.super_type._0_8_ = (long)&target.super_type.m_storage.dummy_ + 8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&target,
                   (pvVar9->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,first._M_current);
        RawText(pRVar10,(string *)&target,true);
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                  ((shared_ptr<markdown::Token> *)&linkId,pRVar10);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,(shared_ptr<markdown::Token> *)&linkId);
LAB_0015222e:
        boost::detail::shared_count::~shared_count((shared_count *)&linkId._M_string_length);
        std::__cxx11::string::~string((string *)&target);
      }
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&url);
      pmVar18 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&contentsOrAlttext;
    }
    else {
      target.super_type._0_8_ = (long)&target.super_type.m_storage.dummy_ + 8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&target,first._M_current,last._M_current);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
LAB_00152259:
    std::__cxx11::string::~string((string *)pmVar18);
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&m);
    if (!bVar6) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string RawText::_processLinksImagesAndTags(const std::string &src,
	ReplacementTable& replacements, const LinkIds& idTable)
{
	// NOTE: Kludge alert! The "inline link or image" regex should be...
	//
	//   "(?:(!?)\\[(.+?)\\] *\\((.*?)\\))"
	//
	// ...but that fails on the 'Images' test because it includes a "stupid URL"
	// that has parentheses within it. The proper way to deal with this would be
	// to match any nested parentheses, but regular expressions can't handle an
	// unknown number of nested items, so I'm cheating -- the regex for it
	// allows for one (and *only* one) pair of matched parentheses within the
	// URL. It makes the regex hard to follow (it was even harder to get right),
	// but it allows it to pass the test.
	//
	// The "reference link or image" one has a similar problem; it should be...
	//
	//   "|(?:(!?)\\[(.+?)\\](?: *\\[(.*?)\\])?)"
	//
	static const boost::regex cExpression(
		"(?:(!?)\\[([^\\]]+?)\\] *\\(([^\\(]*(?:\\(.*?\\).*?)*?)\\))" // Inline link or image
		"|(?:(!?)\\[((?:[^]]*?\\[.*?\\].*?)|(?:.+?))\\](?: *\\[(.*?)\\])?)" // Reference link or image
		"|(?:<(/?([a-zA-Z0-9]+).*?)>)" // potential HTML tag or auto-link
	);
	// Important captures: 1/4=image indicator, 2/5=contents/alttext,
	// 3=URL/title, 6=optional link ID, 7=potential HTML tag or auto-link
	// contents, 8=actual tag from 7.

	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cExpression)) {
			assert(m[0].matched);
			assert(m[0].length()!=0);

			tgt+=std::string(prev, m[0].first);
			tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images1\x01";
			prev=m[0].second;

			bool isImage=false, isLink=false, isReference=false;
			if (m[4].matched && m[4].length()) isImage=isReference=true;
			else if (m[1].matched && m[1].length()) isImage=true;
			else if (m[5].matched) isLink=isReference=true;
			else if (m[2].matched) isLink=true;

			if (isImage || isLink) {
				std::string contentsOrAlttext, url, title;
				bool resolved=false;
				if (isReference) {
					contentsOrAlttext=m[5];
					std::string linkId=(m[6].matched ? std::string(m[6]) : std::string());
					if (linkId.empty()) linkId=cleanTextLinkRef(contentsOrAlttext);

					optional<markdown::LinkIds::Target> target=idTable.find(linkId);
					if (target) { url=target->url; title=target->title; resolved=true; };
				} else {
					static const boost::regex cReference("^<?([^ >]*)>?(?: *(?:('|\")(.*)\\2)|(?:\\((.*)\\)))? *$");
					// Useful captures: 1=url, 3/4=title
					contentsOrAlttext=m[2];
					std::string urlAndTitle=m[3];
					boost::smatch mm;
					if (boost::regex_match(urlAndTitle, mm, cReference)) {
						url=mm[1];
						if (mm[3].matched) title=mm[3];
						else if (mm[4].matched) title=mm[4];
						resolved=true;
					}
				}

				if (!resolved) {
					// Just encode the first character as-is, and continue
					// searching after it.
					prev=m[0].first+1;
					replacements.push_back(TokenPtr(new RawText(std::string(m[0].first, prev))));
				} else if (isImage) {
					replacements.push_back(TokenPtr(new Image(contentsOrAlttext,
						url, title)));
				} else {
					replacements.push_back(TokenPtr(new HtmlAnchorTag(url, title)));
					tgt+=contentsOrAlttext;
					tgt+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@links&Images2\x01";
					replacements.push_back(TokenPtr(new HtmlTag("/a")));
				}
			} else {
				// Otherwise it's an HTML tag or auto-link.
				std::string contents=m[7];

//				cerr << "Evaluating potential HTML or auto-link: " << contents << endl;
//				cerr << "m[8]=" << m[8] << endl;

				if (looksLikeUrl(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(contents)));
					subgroup.push_back(TokenPtr(new RawText(contents, false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (looksLikeEmailAddress(contents)) {
					TokenGroup subgroup;
					subgroup.push_back(TokenPtr(new HtmlAnchorTag(emailEncode("mailto:"+contents))));
					subgroup.push_back(TokenPtr(new RawText(emailEncode(contents), false)));
					subgroup.push_back(TokenPtr(new HtmlTag("/a")));
					replacements.push_back(TokenPtr(new Container(subgroup)));
				} else if (isValidTag(m[8])) {
					replacements.push_back(TokenPtr(new HtmlTag(_restoreProcessedItems(contents, replacements))));
				} else {
					// Just encode it as-is
					replacements.push_back(TokenPtr(new RawText(m[0])));
				}
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}
	return tgt;
}